

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  parasail_result_t *ppVar6;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar7;
  int32_t *ptr_02;
  uint uVar8;
  long lVar9;
  int32_t *piVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  char *__format;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  undefined1 local_198 [16];
  undefined1 local_168 [16];
  undefined1 local_148 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 local_48 [16];
  int iVar36;
  int iVar40;
  int iVar41;
  int iVar42;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "_s2";
  }
  else {
    uVar12 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar13 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar13 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar13 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar13 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_0050d75f:
        uVar26 = s2Len + 3;
        iVar21 = -open;
        iVar23 = matrix->min;
        uVar17 = 0x80000000 - iVar23;
        if (iVar23 != iVar21 && SBORROW4(iVar23,iVar21) == iVar23 + open < 0) {
          uVar17 = open | 0x80000000;
        }
        iVar23 = uVar17 + 1;
        iVar25 = 0x7ffffffe - matrix->max;
        local_168 = (undefined1  [16])0x0;
        if (s1_beg == 0) {
          local_d8 = gap << 2;
          iStack_d4 = gap << 2;
          iStack_d0 = gap << 2;
          iStack_cc = gap << 2;
        }
        else {
          local_d8 = 0;
          iStack_d4 = 0;
          iStack_d0 = 0;
          iStack_cc = 0;
        }
        local_f8._0_8_ = CONCAT44(iVar23,iVar23);
        local_f8._8_8_ = CONCAT44(iVar23,iVar23);
        local_108._8_8_ = local_f8._8_8_;
        local_108._0_8_ = local_f8._0_8_;
        local_c8._8_8_ = local_f8._8_8_;
        local_c8._0_8_ = local_f8._0_8_;
        local_118._8_8_ = local_f8._8_8_;
        local_118._0_8_ = local_f8._0_8_;
        if (s1_beg == 0) {
          local_168._4_4_ = iVar21 + gap * -2;
          local_168._0_4_ = gap * -3 - open;
          local_168._12_4_ = iVar21;
          local_168._8_4_ = iVar21 - gap;
        }
        local_58 = gap;
        iStack_54 = gap;
        iStack_50 = gap;
        iStack_4c = gap;
        ppVar6 = parasail_result_new();
        if (ppVar6 != (parasail_result_t *)0x0) {
          ppVar6->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                         (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar6->flag |
                         0x4401002;
          uVar15 = (ulong)(s2Len + 6);
          ptr = parasail_memalign_int32_t(0x10,uVar15);
          ptr_00 = parasail_memalign_int32_t(0x10,uVar15);
          ptr_01 = parasail_memalign_int32_t(0x10,uVar15);
          if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
            lVar7 = (long)_s1Len;
            if (matrix->type == 0) {
              ptr_02 = parasail_memalign_int32_t(0x10,(long)(int)(_s1Len + 3));
              uVar15 = 0;
              if (ptr_02 == (int32_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar11 = 0;
              if (0 < _s1Len) {
                uVar11 = (ulong)(uint)_s1Len;
              }
              for (; lVar9 = lVar7, uVar11 != uVar15; uVar15 = uVar15 + 1) {
                ptr_02[uVar15] = matrix->mapper[(byte)_s1[uVar15]];
              }
              for (; lVar9 < (int)(_s1Len + 3); lVar9 = lVar9 + 1) {
                ptr_02[lVar9] = 0;
              }
            }
            else {
              ptr_02 = (int32_t *)0x0;
            }
            local_e8 = iVar25;
            iStack_e4 = iVar25;
            iStack_e0 = iVar25;
            iStack_dc = iVar25;
            local_98 = open;
            iStack_94 = open;
            iStack_90 = open;
            iStack_8c = open;
            local_68 = _s1Len;
            uStack_64 = _s1Len;
            uStack_60 = _s1Len;
            uStack_5c = _s1Len;
            local_a8 = _s1Len - 1U;
            iStack_a4 = _s1Len - 1U;
            iStack_a0 = _s1Len - 1U;
            iStack_9c = _s1Len - 1U;
            local_88 = s2Len;
            iStack_84 = s2Len;
            iStack_80 = s2Len;
            iStack_7c = s2Len;
            local_78 = s2Len + -1;
            iStack_74 = s2Len + -1;
            iStack_70 = s2Len + -1;
            iStack_6c = s2Len + -1;
            piVar1 = matrix->mapper;
            for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
              ptr[uVar15 + 3] = piVar1[(byte)_s2[uVar15]];
            }
            for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
              ptr[lVar9] = 0;
            }
            piVar10 = ptr + uVar12 + 3;
            for (uVar15 = uVar12; (int)uVar15 < (int)uVar26; uVar15 = (ulong)((int)uVar15 + 1)) {
              *piVar10 = 0;
              piVar10 = piVar10 + 1;
            }
            uVar15 = 0;
            iVar24 = iVar21;
            if (s2_beg == 0) {
              for (; uVar12 != uVar15; uVar15 = uVar15 + 1) {
                ptr_00[uVar15 + 3] = iVar24;
                ptr_01[uVar15 + 3] = iVar23;
                iVar24 = iVar24 - gap;
              }
            }
            else {
              for (; uVar12 != uVar15; uVar15 = uVar15 + 1) {
                ptr_00[uVar15 + 3] = 0;
                ptr_01[uVar15 + 3] = iVar23;
              }
            }
            for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
              ptr_00[lVar9] = iVar23;
              ptr_01[lVar9] = iVar23;
            }
            for (; (int)uVar12 < (int)uVar26; uVar12 = uVar12 + 1) {
              ptr_00[uVar12 + 3] = iVar23;
              ptr_01[uVar12 + 3] = iVar23;
            }
            ptr_00[2] = 0;
            uVar17 = _s1Len - 1;
            auVar4._4_4_ = iVar23;
            auVar4._0_4_ = iVar23;
            auVar4._8_4_ = iVar23;
            auVar4._12_4_ = iVar23;
            local_b8 = auVar4 >> 0x20;
            if ((int)uVar26 < 1) {
              uVar26 = 0;
            }
            local_1a8 = 3;
            iStack_1a4 = 2;
            iStack_1a0 = 1;
            iStack_19c = 0;
            uVar12 = 0;
            local_148._4_4_ = iVar25;
            local_148._0_4_ = iVar25;
            local_148._12_4_ = iVar25;
            local_148._8_4_ = iVar25;
            local_118 = auVar4;
            auVar50 = auVar4;
            local_c8 = auVar4;
            auVar35 = auVar4;
            local_48 = auVar4;
            local_198 = auVar4;
            while ((long)uVar12 < lVar7) {
              uVar8 = (uint)uVar12;
              if (matrix->type == 0) {
                uVar14 = ptr_02[uVar12 + 1];
                uVar18 = ptr_02[uVar12 + 2];
                uVar16 = ptr_02[uVar12];
                uVar20 = ptr_02[uVar12 | 3];
              }
              else {
                uVar14 = uVar8 | 1;
                if (lVar7 <= (long)(uVar12 | 1)) {
                  uVar14 = uVar17;
                }
                uVar18 = uVar8 | 2;
                if (lVar7 <= (long)(uVar12 | 2)) {
                  uVar18 = uVar17;
                }
                uVar16 = uVar8;
                uVar20 = uVar8 | 3;
                if (lVar7 <= (long)(uVar12 | 3)) {
                  uVar20 = uVar17;
                }
              }
              piVar1 = matrix->matrix;
              iVar24 = matrix->size;
              iVar22 = iVar21 - uVar8 * gap;
              auVar30._0_12_ = auVar4._4_12_;
              auVar30._12_4_ = ptr_00[2];
              if (s1_beg != 0) {
                iVar22 = 0;
              }
              auVar28._12_4_ = iVar22;
              auVar28._0_12_ = auVar30._0_12_;
              uVar12 = uVar12 + 4;
              ptr_00[2] = iVar21 - (int)uVar12 * gap;
              auVar44._4_4_ = iVar23;
              auVar44._0_4_ = iVar23;
              auVar44._8_4_ = iVar23;
              auVar44._12_4_ = iVar23;
              auVar34 = _DAT_008a1b30;
              auVar52 = auVar44;
              for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
                iVar22 = ptr_00[uVar15 + 3];
                auVar47._0_4_ = auVar28._4_4_ - open;
                auVar47._4_4_ = auVar28._8_4_ - open;
                auVar47._8_4_ = auVar28._12_4_ - open;
                auVar47._12_4_ = iVar22 - open;
                auVar54._0_4_ = auVar44._4_4_ - local_58;
                auVar54._4_4_ = auVar44._8_4_ - iStack_54;
                auVar54._8_4_ = auVar44._12_4_ - iStack_50;
                auVar54._12_4_ = ptr_01[uVar15 + 3] - iStack_4c;
                auVar43._0_4_ = -(uint)(auVar54._0_4_ < auVar47._0_4_);
                auVar43._4_4_ = -(uint)(auVar54._4_4_ < auVar47._4_4_);
                auVar43._8_4_ = -(uint)(auVar54._8_4_ < auVar47._8_4_);
                auVar43._12_4_ = -(uint)(auVar54._12_4_ < auVar47._12_4_);
                auVar44 = ~auVar43 & auVar54 | auVar47 & auVar43;
                auVar31._0_4_ = auVar28._0_4_ - open;
                auVar31._4_4_ = auVar28._4_4_ - open;
                auVar31._8_4_ = auVar28._8_4_ - open;
                auVar31._12_4_ = auVar28._12_4_ - open;
                auVar51._0_4_ = auVar52._0_4_ - local_58;
                auVar51._4_4_ = auVar52._4_4_ - iStack_54;
                auVar51._8_4_ = auVar52._8_4_ - iStack_50;
                auVar51._12_4_ = auVar52._12_4_ - iStack_4c;
                auVar53._0_4_ = -(uint)(auVar51._0_4_ < auVar31._0_4_);
                auVar53._4_4_ = -(uint)(auVar51._4_4_ < auVar31._4_4_);
                auVar53._8_4_ = -(uint)(auVar51._8_4_ < auVar31._8_4_);
                auVar53._12_4_ = -(uint)(auVar51._12_4_ < auVar31._12_4_);
                auVar54 = ~auVar53 & auVar51 | auVar31 & auVar53;
                auVar48._0_4_ =
                     piVar1[(long)(int)(uVar20 * iVar24) + (long)ptr[uVar15]] + auVar30._0_4_;
                auVar48._4_4_ =
                     piVar1[(long)(int)(uVar18 * iVar24) + (long)ptr[uVar15 + 1]] + auVar30._4_4_;
                auVar48._8_4_ =
                     piVar1[(long)(int)(uVar14 * iVar24) + (long)ptr[uVar15 + 2]] + auVar30._8_4_;
                auVar48._12_4_ =
                     piVar1[(long)(int)(uVar16 * iVar24) + (long)ptr[uVar15 + 3]] + auVar30._12_4_;
                auVar29._0_4_ = -(uint)(auVar54._0_4_ < auVar48._0_4_);
                auVar29._4_4_ = -(uint)(auVar54._4_4_ < auVar48._4_4_);
                auVar29._8_4_ = -(uint)(auVar54._8_4_ < auVar48._8_4_);
                auVar29._12_4_ = -(uint)(auVar54._12_4_ < auVar48._12_4_);
                auVar30 = ~auVar29 & auVar54 | auVar48 & auVar29;
                auVar49._0_4_ = -(uint)(auVar44._0_4_ < auVar30._0_4_);
                auVar49._4_4_ = -(uint)(auVar44._4_4_ < auVar30._4_4_);
                auVar49._8_4_ = -(uint)(auVar44._8_4_ < auVar30._8_4_);
                auVar49._12_4_ = -(uint)(auVar44._12_4_ < auVar30._12_4_);
                auVar30 = ~auVar49 & auVar44 | auVar30 & auVar49;
                iVar36 = auVar34._0_4_;
                auVar37._0_4_ = -(uint)(iVar36 == -1);
                iVar40 = auVar34._4_4_;
                auVar37._4_4_ = -(uint)(iVar40 == -1);
                iVar41 = auVar34._8_4_;
                iVar42 = auVar34._12_4_;
                auVar37._8_4_ = -(uint)(iVar41 == -1);
                auVar37._12_4_ = -(uint)(iVar42 == -1);
                auVar31 = local_168 & auVar37 | ~auVar37 & auVar30;
                auVar52._4_4_ = iVar23;
                auVar52._0_4_ = iVar23;
                auVar52._8_4_ = iVar23;
                auVar52._12_4_ = iVar23;
                auVar44 = ~auVar37 & auVar44 | auVar52 & auVar37;
                iVar27 = auVar31._0_4_;
                iVar19 = auVar31._4_4_;
                iVar33 = auVar31._12_4_;
                iVar32 = auVar31._8_4_;
                if (3 < uVar15) {
                  auVar45._0_4_ = -(uint)(iVar27 < local_148._0_4_);
                  auVar45._4_4_ = -(uint)(iVar19 < local_148._4_4_);
                  auVar45._8_4_ = -(uint)(iVar32 < local_148._8_4_);
                  auVar45._12_4_ = -(uint)(iVar33 < local_148._12_4_);
                  local_148 = ~auVar45 & local_148 | auVar31 & auVar45;
                  auVar55._0_4_ = -(uint)(iVar27 < local_198._0_4_);
                  auVar55._4_4_ = -(uint)(iVar19 < local_198._4_4_);
                  auVar55._8_4_ = -(uint)(iVar32 < local_198._8_4_);
                  auVar55._12_4_ = -(uint)(iVar33 < local_198._12_4_);
                  local_198 = local_198 & auVar55 | ~auVar55 & auVar31;
                }
                auVar52 = auVar52 & auVar37 | ~auVar37 & auVar54;
                auVar3._4_4_ = iStack_1a4;
                auVar3._0_4_ = local_1a8;
                auVar3._8_4_ = iStack_1a0;
                auVar3._12_4_ = iStack_19c;
                auVar38._0_4_ = -(uint)(local_1a8 < _s1Len);
                auVar38._4_4_ = -(uint)(iStack_1a4 < _s1Len);
                auVar38._8_4_ = -(uint)(iStack_1a0 < _s1Len);
                auVar38._12_4_ = -(uint)(iStack_19c < _s1Len);
                auVar58._0_4_ = -(uint)(s2Len + -1 == iVar36);
                auVar58._4_4_ = -(uint)(s2Len + -1 == iVar40);
                auVar58._8_4_ = -(uint)(s2Len + -1 == iVar41);
                auVar58._12_4_ = -(uint)(s2Len + -1 == iVar42);
                auVar46._0_4_ = -(uint)(iVar36 < s2Len);
                auVar46._4_4_ = -(uint)(iVar40 < s2Len);
                auVar46._8_4_ = -(uint)(iVar41 < s2Len);
                auVar46._12_4_ = -(uint)(iVar42 < s2Len);
                auVar56._0_4_ = iVar36 >> 0x1f;
                auVar56._4_4_ = iVar40 >> 0x1f;
                auVar56._8_4_ = iVar41 >> 0x1f;
                auVar56._12_4_ = iVar42 >> 0x1f;
                auVar57._0_4_ = -(uint)(auVar50._0_4_ < iVar27);
                auVar57._4_4_ = -(uint)(auVar50._4_4_ < iVar19);
                auVar57._8_4_ = -(uint)(auVar50._8_4_ < iVar32);
                auVar57._12_4_ = -(uint)(auVar50._12_4_ < iVar33);
                auVar5._4_4_ = -(uint)(_s1Len - 1U == iStack_1a4);
                auVar5._0_4_ = -(uint)(_s1Len - 1U == local_1a8);
                auVar5._8_4_ = -(uint)(_s1Len - 1U == iStack_1a0);
                auVar5._12_4_ = -(uint)(_s1Len - 1U == iStack_19c);
                auVar57 = ~auVar56 & auVar46 & auVar5 & auVar57;
                auVar39._0_4_ = -(uint)(auVar35._0_4_ < iVar27);
                auVar39._4_4_ = -(uint)(auVar35._4_4_ < iVar19);
                auVar39._8_4_ = -(uint)(auVar35._8_4_ < iVar32);
                auVar39._12_4_ = -(uint)(auVar35._12_4_ < iVar33);
                auVar39 = auVar38 & auVar58 & auVar39;
                auVar50 = auVar30 & auVar57 | ~auVar57 & auVar50;
                local_108 = auVar31 & auVar39 | ~auVar39 & auVar35;
                local_c8 = ~(auVar58 & auVar5) & local_c8 | auVar31 & auVar58 & auVar5;
                ptr_00[uVar15] = iVar27;
                ptr_01[uVar15] = auVar44._0_4_;
                local_118 = ~auVar39 & local_118 | auVar3 & auVar39;
                local_48 = ~auVar57 & local_48 | auVar34 & auVar57;
                auVar34._0_4_ = iVar36 + 1;
                auVar34._4_4_ = iVar40 + 1;
                auVar34._8_4_ = iVar41 + 1;
                auVar34._12_4_ = iVar42 + 1;
                auVar30._0_12_ = auVar28._4_12_;
                auVar30._12_4_ = iVar22;
                auVar28 = auVar31;
                auVar35 = local_108;
                local_f8 = auVar50;
              }
              local_1a8 = local_1a8 + 4;
              iStack_1a4 = iStack_1a4 + 4;
              iStack_1a0 = iStack_1a0 + 4;
              iStack_19c = iStack_19c + 4;
              local_168._4_4_ = local_168._4_4_ - iStack_d4;
              local_168._0_4_ = local_168._0_4_ - local_d8;
              local_168._8_4_ = local_168._8_4_ - iStack_d0;
              local_168._12_4_ = local_168._12_4_ - iStack_cc;
            }
            iVar21 = 0;
            uVar8 = 0;
            uVar26 = 0;
            iVar24 = iVar23;
            iVar22 = iVar23;
            iVar27 = iVar23;
            for (lVar7 = 0; (int)lVar7 != 4; lVar7 = lVar7 + 1) {
              iVar19 = *(int *)(local_108 + lVar7 * 4);
              if (iVar22 < iVar19) {
                iVar22 = iVar19;
                uVar26 = *(uint *)(local_118 + lVar7 * 4);
                uVar8 = *(uint *)(local_118 + lVar7 * 4);
              }
              else if ((iVar19 == iVar22) &&
                      (uVar14 = *(uint *)(local_118 + lVar7 * 4), bVar2 = (int)uVar14 < (int)uVar26,
                      uVar26 = uVar8, bVar2)) {
                iVar22 = iVar19;
                uVar26 = uVar14;
                uVar8 = uVar14;
              }
              if (iVar24 < *(int *)(local_f8 + lVar7 * 4)) {
                iVar21 = *(int *)(local_48 + lVar7 * 4);
                iVar24 = *(int *)(local_f8 + lVar7 * 4);
              }
              if (iVar27 < *(int *)(local_c8 + lVar7 * 4)) {
                iVar27 = *(int *)(local_c8 + lVar7 * 4);
              }
            }
            if (s1_end == 0 || s2_end == 0) {
              iVar19 = s2Len + -1;
              if ((s1_end == 0) && (iVar22 = iVar27, uVar26 = uVar17, s2_end != 0)) {
                iVar22 = iVar24;
                iVar19 = iVar21;
              }
            }
            else if (iVar24 < iVar22) {
              iVar21 = s2Len + -1;
              iVar19 = iVar21;
            }
            else if ((iVar22 != iVar24) || (iVar19 = s2Len + -1, iVar21 != s2Len + -1)) {
              iVar22 = iVar24;
              uVar26 = uVar17;
              iVar19 = iVar21;
            }
            auVar50._0_4_ = -(uint)((int)local_148._0_4_ < iVar23);
            auVar50._4_4_ = -(uint)((int)local_148._4_4_ < iVar23);
            auVar50._8_4_ = -(uint)((int)local_148._8_4_ < iVar23);
            auVar50._12_4_ = -(uint)((int)local_148._12_4_ < iVar23);
            auVar35._0_4_ = -(uint)(iVar25 < (int)local_198._0_4_);
            auVar35._4_4_ = -(uint)(iVar25 < (int)local_198._4_4_);
            auVar35._8_4_ = -(uint)(iVar25 < (int)local_198._8_4_);
            auVar35._12_4_ = -(uint)(iVar25 < (int)local_198._12_4_);
            iVar23 = movmskps(iVar21,auVar35 | auVar50);
            if (iVar23 != 0) {
              *(byte *)&ppVar6->flag = (byte)ppVar6->flag | 0x40;
              iVar22 = 0;
              iVar19 = 0;
              uVar26 = 0;
            }
            ppVar6->score = iVar22;
            ppVar6->end_query = uVar26;
            ppVar6->end_ref = iVar19;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(ptr_02);
              return ppVar6;
            }
            return ppVar6;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar13 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_0050d75f;
        __format = "%s: %s must be > 0\n";
        pcVar13 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_diag_sse2_128_32",pcVar13);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}